

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::render
          (QWidgetPrivate *this,QPaintDevice *target,QPoint *targetOffset,QRegion *sourceRegion,
          RenderFlags renderFlags)

{
  long lVar1;
  QWExtra *pQVar2;
  QPoint QVar3;
  QPaintDevice *pQVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  QPainter *pQVar8;
  undefined8 uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  long in_FS_OFFSET;
  QPainter *local_80;
  QRegion local_70;
  QRegion targetSystemClip;
  QPoint local_60;
  QRegion paintRegion;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (target == (QPaintDevice *)0x0) {
    paintRegion.d._0_4_ = 2;
    paintRegion.d._4_4_ = 0;
    QMessageLogger::warning((char *)&paintRegion,"QWidget::render: null pointer to paint device");
    goto LAB_002f8b94;
  }
  pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar2 == (QWExtra *)0x0) {
LAB_002f89c0:
    paintRegion.d._4_4_ = 0xaaaaaaaa;
    paintRegion.d._0_4_ = 0xaaaaaaaa;
    prepareToRender((QWidgetPrivate *)&paintRegion,(QRegion *)this,
                    (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(sourceRegion,0));
    bVar5 = false;
  }
  else {
    paintRegion.d._0_4_ = 0xaaaaaaaa;
    paintRegion.d._4_4_ = 0xaaaaaaaa;
    if ((*(ushort *)&pQVar2->field_0x7c & 0x40) == 0) goto LAB_002f89c0;
    QRegion::QRegion(&paintRegion,sourceRegion);
    bVar5 = true;
  }
  cVar6 = QRegion::isEmpty();
  if (cVar6 == '\0') {
    if (bVar5) {
      local_80 = sharedPainter(this);
    }
    else {
      local_80 = (QPainter *)0x0;
    }
    iVar7 = (**(code **)(*(long *)target + 0x10))(target);
    if (iVar7 == 1) {
      pQVar2 = ((*(QWidgetPrivate **)(target + -8))->extra)._M_t.
               super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if ((((pQVar2 != (QWExtra *)0x0) && ((pQVar2->field_0x7c & 0x40) != 0)) &&
          (pQVar8 = sharedPainter(*(QWidgetPrivate **)(target + -8)), pQVar8 != (QPainter *)0x0)) &&
         (cVar6 = QPainter::isActive(), cVar6 != '\0')) {
        setSharedPainter(this,pQVar8);
      }
    }
    QVar3 = *targetOffset;
    uVar9 = QRegion::boundingRect();
    iVar11 = QVar3.xp.m_i.m_i - (int)uVar9;
    iVar12 = QVar3.yp.m_i.m_i - (int)((ulong)uVar9 >> 0x20);
    local_60.xp.m_i = iVar11;
    local_60.yp.m_i = iVar12;
    iVar7 = (**(code **)(*(long *)target + 0x10))(target);
    if (iVar7 == 1) {
      pQVar4 = *(QPaintDevice **)(*(long *)(target + -8) + 0xa8);
      if (pQVar4 != (QPaintDevice *)0x0) {
        uVar9 = *(undefined8 *)(*(long *)(target + -8) + 0x218);
        local_60.xp.m_i = iVar11 - (int)uVar9;
        local_60.yp.m_i = iVar12 - (int)((ulong)uVar9 >> 0x20);
        target = pQVar4;
      }
    }
    if ((!bVar5) && (lVar10 = (**(code **)(*(long *)target + 0x18))(target), lVar10 != 0)) {
      targetSystemClip.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
      QPaintEngine::systemClip();
      cVar6 = QRegion::isEmpty();
      if (cVar6 == '\0') {
        QRegion::translated(&local_70,(QPoint *)&targetSystemClip);
        QRegion::operator&=(&paintRegion,&local_70);
        QRegion::~QRegion(&local_70);
      }
      QRegion::~QRegion(&targetSystemClip);
    }
    iVar7 = 0xe;
    if (((uint)renderFlags.super_QFlagsStorageHelper<QWidget::RenderFlag,_4>.
               super_QFlagsStorage<QWidget::RenderFlag>.i & 2) == 0) {
      iVar7 = 0x1a;
    }
    pQVar8 = sharedPainter(this);
    drawWidget(this,target,&paintRegion,&local_60,
               (DrawWidgetFlags)
               (((uint)renderFlags.super_QFlagsStorageHelper<QWidget::RenderFlag,_4>.
                       super_QFlagsStorage<QWidget::RenderFlag>.i & 1) + iVar7 + 0x80),pQVar8,
               (QWidgetRepaintManager *)0x0);
    if (local_80 != (QPainter *)0x0) {
      setSharedPainter(this,local_80);
    }
  }
  QRegion::~QRegion(&paintRegion);
LAB_002f8b94:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::render(QPaintDevice *target, const QPoint &targetOffset,
                            const QRegion &sourceRegion, QWidget::RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!target)) {
        qWarning("QWidget::render: null pointer to paint device");
        return;
    }

    const bool inRenderWithPainter = extra && extra->inRenderWithPainter;
    QRegion paintRegion = !inRenderWithPainter
                          ? prepareToRender(sourceRegion, renderFlags)
                          : sourceRegion;
    if (paintRegion.isEmpty())
        return;

    QPainter *oldSharedPainter = inRenderWithPainter ? sharedPainter() : nullptr;

    // Use the target's shared painter if set (typically set when doing
    // "other->render(widget);" in the widget's paintEvent.
    if (target->devType() == QInternal::Widget) {
        QWidgetPrivate *targetPrivate = static_cast<QWidget *>(target)->d_func();
        if (targetPrivate->extra && targetPrivate->extra->inRenderWithPainter) {
            QPainter *targetPainter = targetPrivate->sharedPainter();
            if (targetPainter && targetPainter->isActive())
                setSharedPainter(targetPainter);
        }
    }

    // Use the target's redirected device if set and adjust offset and paint
    // region accordingly. This is typically the case when people call render
    // from the paintEvent.
    QPoint offset = targetOffset;
    offset -= paintRegion.boundingRect().topLeft();
    QPoint redirectionOffset;
    QPaintDevice *redirected = nullptr;

    if (target->devType() == QInternal::Widget)
        redirected = static_cast<QWidget *>(target)->d_func()->redirected(&redirectionOffset);

    if (redirected) {
        target = redirected;
        offset -= redirectionOffset;
    }

    if (!inRenderWithPainter) { // Clip handled by shared painter (in qpainter.cpp).
        if (QPaintEngine *targetEngine = target->paintEngine()) {
            const QRegion targetSystemClip = targetEngine->systemClip();
            if (!targetSystemClip.isEmpty())
                paintRegion &= targetSystemClip.translated(-offset);
        }
    }

    // Set backingstore flags.
    DrawWidgetFlags flags = DrawPaintOnScreen | DrawInvisible;
    if (renderFlags & QWidget::DrawWindowBackground)
        flags |= DrawAsRoot;

    if (renderFlags & QWidget::DrawChildren)
        flags |= DrawRecursive;
    else
        flags |= DontSubtractOpaqueChildren;

    flags |= DontSetCompositionMode;

    // Render via backingstore.
    drawWidget(target, paintRegion, offset, flags, sharedPainter());

    // Restore shared painter.
    if (oldSharedPainter)
        setSharedPainter(oldSharedPainter);
}